

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptReflect.cpp
# Opt level: O0

Var Js::JavascriptReflect::EntrySetPrototypeOf(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  bool bVar2;
  int n;
  CallFlags CVar3;
  BOOL BVar4;
  ScriptContext *pSVar5;
  ThreadContext *this;
  Var *values;
  undefined4 *puVar6;
  Var pvVar7;
  RecyclableObject *pRVar8;
  RecyclableObject *newPrototype_00;
  JavascriptLibrary *this_00;
  BOOL changeResult;
  RecyclableObject *newPrototype;
  Var target;
  undefined1 local_70 [8];
  AutoTagNativeLibraryEntry __tag;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar5 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetThreadContext(pSVar5);
  pSVar5 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(this,0xc00,pSVar5,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptReflect.cpp"
                                ,0x133,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  __tag.entry.next = (Entry *)RecyclableObject::GetScriptContext(function);
  AutoTagNativeLibraryEntry::AutoTagNativeLibraryEntry
            ((AutoTagNativeLibraryEntry *)local_70,function,(CallInfo)function_local,
             L"Reflect.setPrototypeOf",&stack0x00000000);
  if (((uint)scriptContext & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptReflect.cpp"
                                ,0x137,"(args.Info.Count > 0)",
                                "Should always have implicit \'this\'");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  CVar3 = Js::operator&((uint)scriptContext >> 0x18,CallFlags_New);
  if (CVar3 != CallFlags_None) {
    JavascriptError::ThrowTypeError
              ((ScriptContext *)__tag.entry.next,-0x7ff5ebf5,L"Reflect.setPrototypeOf");
  }
  if (1 < ((uint)scriptContext & 0xffffff)) {
    pvVar7 = Arguments::operator[]((Arguments *)&scriptContext,1);
    BVar4 = Js::JavascriptOperators::IsObject(pvVar7);
    if (BVar4 != 0) {
      pvVar7 = Arguments::operator[]((Arguments *)&scriptContext,1);
      pRVar8 = Js::JavascriptOperators::ToObject(pvVar7,(ScriptContext *)__tag.entry.next);
      if (2 < ((uint)scriptContext & 0xffffff)) {
        pvVar7 = Arguments::operator[]((Arguments *)&scriptContext,2);
        BVar4 = Js::JavascriptOperators::IsObjectOrNull(pvVar7);
        if (BVar4 != 0) {
          pvVar7 = Arguments::operator[]((Arguments *)&scriptContext,2);
          newPrototype_00 = VarTo<Js::RecyclableObject>(pvVar7);
          pRVar8 = VarTo<Js::RecyclableObject>(pRVar8);
          BVar4 = JavascriptObject::ChangePrototype
                            (pRVar8,newPrototype_00,false,(ScriptContext *)__tag.entry.next);
          this_00 = ScriptContext::GetLibrary((ScriptContext *)__tag.entry.next);
          pvVar7 = JavascriptLibrary::GetTrueOrFalse(this_00,BVar4);
          AutoTagNativeLibraryEntry::~AutoTagNativeLibraryEntry
                    ((AutoTagNativeLibraryEntry *)local_70);
          return pvVar7;
        }
      }
      JavascriptError::ThrowTypeError
                ((ScriptContext *)__tag.entry.next,-0x7ff5ec31,L"Object.setPrototypeOf");
    }
  }
  JavascriptError::ThrowTypeError
            ((ScriptContext *)__tag.entry.next,-0x7ff5ec36,L"Reflect.setPrototypeOf");
}

Assistant:

Var JavascriptReflect::EntrySetPrototypeOf(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();
        AUTO_TAG_NATIVE_LIBRARY_ENTRY(function, callInfo, _u("Reflect.setPrototypeOf"));

        AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");
        if  (args.Info.Flags & CallFlags_New)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_ErrorOnNew, _u("Reflect.setPrototypeOf"));
        }

        if (args.Info.Count < 2 || !JavascriptOperators::IsObject(args[1]))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedObject, _u("Reflect.setPrototypeOf"));
        }
        Var target = args[1];
        target = JavascriptOperators::ToObject(target, scriptContext);

        if (args.Info.Count < 3 || !JavascriptOperators::IsObjectOrNull(args[2]))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NotObjectOrNull, _u("Object.setPrototypeOf"));
        }

        RecyclableObject* newPrototype = VarTo<RecyclableObject>(args[2]);
        BOOL changeResult = JavascriptObject::ChangePrototype(VarTo<RecyclableObject>(target), newPrototype, /*validate*/false, scriptContext);

        return scriptContext->GetLibrary()->GetTrueOrFalse(changeResult);
    }